

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_futils.c
# Opt level: O3

SUNErrCode SUNDIALSFileOpen(char *filename,char *mode,FILE **fp_out)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 *puVar3;
  SUNErrCode SVar4;
  
  if (filename == (char *)0x0) {
    pFVar2 = (FILE *)*fp_out;
  }
  else {
    iVar1 = strcmp(filename,"stdout");
    if (iVar1 == 0) {
      puVar3 = (undefined8 *)&stdout;
    }
    else {
      iVar1 = strcmp(filename,"stderr");
      if (iVar1 != 0) {
        pFVar2 = fopen(filename,mode);
        goto LAB_0010a4db;
      }
      puVar3 = (undefined8 *)&stderr;
    }
    pFVar2 = (FILE *)*puVar3;
  }
LAB_0010a4db:
  SVar4 = -0x2707;
  if (pFVar2 != (FILE *)0x0) {
    SVar4 = 0;
  }
  *fp_out = (FILE *)pFVar2;
  return SVar4;
}

Assistant:

SUNErrCode SUNDIALSFileOpen(const char* filename, const char* mode, FILE** fp_out)
{
  SUNErrCode err = SUN_SUCCESS;
  FILE* fp       = *fp_out;

  if (filename)
  {
    if (!strcmp(filename, "stdout")) { fp = stdout; }
    else if (!strcmp(filename, "stderr")) { fp = stderr; }
    else { fp = fopen(filename, mode); }
  }

  if (!fp) { err = SUN_ERR_FILE_OPEN; }

  *fp_out = fp;
  return err;
}